

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_ycbcr_conversion
          (Impl *this,VkSamplerYcbcrConversionCreateInfo *create_info,ScratchAllocator *alloc,
          VkSamplerYcbcrConversionCreateInfo **out_info)

{
  void *pvVar1;
  undefined8 uVar2;
  VkFilter VVar3;
  VkBool32 VVar4;
  undefined4 uVar5;
  VkComponentSwizzle VVar6;
  VkComponentSwizzle VVar7;
  VkFormat VVar8;
  VkSamplerYcbcrModelConversion VVar9;
  VkSamplerYcbcrRange VVar10;
  VkComponentSwizzle VVar11;
  VkStructureType VVar12;
  undefined4 uVar13;
  VkSamplerYcbcrConversionCreateInfo *pVVar14;
  
  pVVar14 = (VkSamplerYcbcrConversionCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x40,0x10);
  if (pVVar14 != (VkSamplerYcbcrConversionCreateInfo *)0x0) {
    VVar12 = create_info->sType;
    uVar13 = *(undefined4 *)&create_info->field_0x4;
    pvVar1 = create_info->pNext;
    VVar8 = create_info->format;
    VVar9 = create_info->ycbcrModel;
    VVar10 = create_info->ycbcrRange;
    VVar11 = (create_info->components).r;
    VVar6 = (create_info->components).g;
    VVar7 = (create_info->components).b;
    uVar2 = *(undefined8 *)&(create_info->components).a;
    VVar3 = create_info->chromaFilter;
    VVar4 = create_info->forceExplicitReconstruction;
    uVar5 = *(undefined4 *)&create_info->field_0x3c;
    pVVar14->yChromaOffset = create_info->yChromaOffset;
    pVVar14->chromaFilter = VVar3;
    pVVar14->forceExplicitReconstruction = VVar4;
    *(undefined4 *)&pVVar14->field_0x3c = uVar5;
    (pVVar14->components).g = VVar6;
    (pVVar14->components).b = VVar7;
    *(undefined8 *)&(pVVar14->components).a = uVar2;
    pVVar14->format = VVar8;
    pVVar14->ycbcrModel = VVar9;
    pVVar14->ycbcrRange = VVar10;
    (pVVar14->components).r = VVar11;
    pVVar14->sType = VVar12;
    *(undefined4 *)&pVVar14->field_0x4 = uVar13;
    pVVar14->pNext = pvVar1;
  }
  pvVar1 = create_info->pNext;
  if (pvVar1 == (void *)0x0) {
    *out_info = pVVar14;
  }
  return pvVar1 == (void *)0x0;
}

Assistant:

bool StateRecorder::Impl::copy_ycbcr_conversion(const VkSamplerYcbcrConversionCreateInfo *create_info,
                                                ScratchAllocator &alloc, VkSamplerYcbcrConversionCreateInfo **out_info)
{
	auto *info = copy(create_info, 1, alloc);

	// Don't support pNext in this struct.
	if (create_info->pNext)
		return false;

	*out_info = info;
	return true;
}